

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_packets.c
# Opt level: O1

int main(int argc,char **args)

{
  char *file_path;
  int iVar1;
  light_pcapng_t *pcapng;
  light_pcapng_file_info *plVar2;
  ulong uVar3;
  uint8_t *pkt_data;
  ulong local_80;
  char **local_78;
  ulong local_70;
  light_packet_header pkt_header;
  
  if (1 < argc) {
    local_80 = (ulong)(uint)argc;
    uVar3 = 1;
    local_78 = args;
    do {
      file_path = local_78[uVar3];
      pcapng = light_pcapng_open_read(file_path,LIGHT_FALSE);
      if (pcapng == (light_pcapng_t *)0x0) {
        fprintf(_stderr,"Unable to read pcapng: %s\n",file_path);
      }
      else {
        plVar2 = light_pcang_get_file_info(pcapng);
        printf("file version is %d.%d\n",(ulong)plVar2->major_version,(ulong)plVar2->minor_version);
        if (plVar2->file_comment != (char *)0x0) {
          printf("file comment is: %s\n");
        }
        if (plVar2->os_desc != (char *)0x0) {
          printf("os is: %s\n");
        }
        local_70 = uVar3;
        if (plVar2->hardware_desc != (char *)0x0) {
          printf("hardware description is: %s\n");
        }
        if (plVar2->user_app_desc != (char *)0x0) {
          printf("user app is: %s\n");
        }
        uVar3 = 1;
        do {
          pkt_data = (uint8_t *)0x0;
          iVar1 = light_get_next_packet(pcapng,&pkt_header,&pkt_data);
          if ((iVar1 != 0) && (pkt_data != (uint8_t *)0x0)) {
            printf("packet #%d: orig_len=%d, cap_len=%d, iface_id=%d, data_link=%d, timestamp=%d.%06d"
                   ,uVar3,(ulong)pkt_header.original_length,(ulong)pkt_header.captured_length,
                   (ulong)pkt_header.interface_id,(ulong)pkt_header.data_link,
                   (ulong)(uint)pkt_header.timestamp.tv_sec,
                   (ulong)(uint)pkt_header.timestamp.tv_usec);
            if (pkt_header.comment_length == 0) {
              putchar(10);
            }
            else {
              printf(", comment=\"%s\"\n",pkt_header.comment);
            }
            uVar3 = (ulong)((int)uVar3 + 1);
          }
        } while (iVar1 != 0);
        printf("interface count in file: %d\n");
        light_pcapng_close(pcapng);
        uVar3 = local_70;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != local_80);
  }
  return 0;
}

Assistant:

int main(int argc, const char **args) {
	int i;

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		light_pcapng_t *pcapng = light_pcapng_open_read(file, LIGHT_FALSE);
		if (pcapng != NULL) {
			light_pcapng_file_info *info = light_pcang_get_file_info(pcapng);
			printf("file version is %d.%d\n", info->major_version, info->minor_version);
			if (info->file_comment != NULL)
				printf("file comment is: %s\n", info->file_comment);
			if (info->os_desc != NULL)
				printf("os is: %s\n", info->os_desc);
			if (info->hardware_desc != NULL)
				printf("hardware description is: %s\n", info->hardware_desc);
			if (info->user_app_desc != NULL)
				printf("user app is: %s\n", info->user_app_desc);

			int index = 1;

			while (1) {
				light_packet_header pkt_header;
				const uint8_t *pkt_data = NULL;
				int res = 0;

				res = light_get_next_packet(pcapng, &pkt_header, &pkt_data);
				if (!res)
					break;

				if (pkt_data != NULL) {
					printf("packet #%d: orig_len=%d, cap_len=%d, iface_id=%d, data_link=%d, timestamp=%d.%06d",
							index,
							pkt_header.original_length,
							pkt_header.captured_length,
							pkt_header.interface_id,
							pkt_header.data_link,
							(int)pkt_header.timestamp.tv_sec,
							(int)pkt_header.timestamp.tv_usec);
					if (pkt_header.comment_length > 0)
						printf(", comment=\"%s\"\n", pkt_header.comment);
					else
						printf("\n");

					index++;
				}
			}

			printf("interface count in file: %d\n", info->interface_block_count);

			light_pcapng_close(pcapng);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	return 0;
}